

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O2

void __thiscall
cppnet::TimerContainer::DoTimer
          (TimerContainer *this,
          vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
          *run_timer_solts,
          vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
          *sub_timer_solts)

{
  TimerContainer *this_00;
  element_type *peVar1;
  bool bVar2;
  uint32_t uVar3;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pwVar4;
  shared_ptr<cppnet::TimerSlot> ptr;
  shared_ptr<cppnet::TimerContainer> root_timer;
  __shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2> local_a0;
  TimerContainer *local_90;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *local_88;
  vector<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
  *local_80;
  weak_ptr<cppnet::TimerContainer> *local_78;
  __weak_ptr<cppnet::TimerSlot,(__gnu_cxx::_Lock_policy)2> local_70 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __weak_ptr<cppnet::TimerSlot,(__gnu_cxx::_Lock_policy)2> local_60 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_78 = &this->_root_timer;
  local_88 = &local_58;
  local_90 = this;
  local_80 = sub_timer_solts;
  for (pwVar4 = (run_timer_solts->
                super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pwVar4 != (run_timer_solts->
                super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; pwVar4 = pwVar4 + 1) {
    std::__shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_a0,pwVar4)
    ;
    if (local_a0._M_ptr != (TimerSlot *)0x0) {
      (**(local_a0._M_ptr)->_vptr_TimerSlot)();
      TimerSlot::RmInTimer(local_a0._M_ptr);
      bVar2 = TimerSlot::IsAlways(local_a0._M_ptr);
      if (bVar2) {
        TimerSlot::ResetTime(local_a0._M_ptr);
        std::__shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_50,local_78);
        peVar1 = local_50._M_ptr;
        if (local_50._M_ptr == (element_type *)0x0) {
          std::__weak_ptr<cppnet::TimerSlot,(__gnu_cxx::_Lock_policy)2>::
          __weak_ptr<cppnet::TimerSlot,void>(local_70,&local_a0);
          uVar3 = TimerSlot::GetTotalInterval(local_a0._M_ptr);
          bVar2 = TimerSlot::IsAlways(local_a0._M_ptr);
          (**(local_90->super_Timer)._vptr_Timer)(local_90,local_70,(ulong)uVar3,(ulong)bVar2);
          this_01 = &local_68;
        }
        else {
          std::__weak_ptr<cppnet::TimerSlot,(__gnu_cxx::_Lock_policy)2>::
          __weak_ptr<cppnet::TimerSlot,void>(local_60,&local_a0);
          uVar3 = TimerSlot::GetTotalInterval(local_a0._M_ptr);
          bVar2 = TimerSlot::IsAlways(local_a0._M_ptr);
          (**(peVar1->super_Timer)._vptr_Timer)(peVar1,local_60,(ulong)uVar3,(ulong)bVar2);
          this_01 = &local_58;
        }
        std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(this_01);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
  }
  if ((local_90->_sub_timer).super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    for (pwVar4 = (local_80->
                  super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pwVar4 != (local_80->
                  super__Vector_base<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; pwVar4 = pwVar4 + 1) {
      std::__shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_a0,pwVar4);
      if (local_a0._M_ptr != (TimerSlot *)0x0) {
        this_00 = (local_90->_sub_timer).
                  super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,&local_a0);
        uVar3 = TimerSlot::GetLeftInterval(local_a0._M_ptr);
        InnerAddTimer(this_00,(shared_ptr<cppnet::TimerSlot> *)&local_40,uVar3);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
    }
  }
  return;
}

Assistant:

void TimerContainer::DoTimer(std::vector<std::weak_ptr<TimerSlot>>& run_timer_solts,
    std::vector<std::weak_ptr<TimerSlot>>& sub_timer_solts) {
    // timer call back
    for (auto iter = run_timer_solts.begin(); iter != run_timer_solts.end(); iter++) {
        auto ptr = iter->lock();
        if (!ptr) {
            continue;
        }
        ptr->OnTimer();
        ptr->RmInTimer();

        // add timer again
        if (ptr->IsAlways()) {
            ptr->ResetTime();
            auto root_timer = _root_timer.lock();
            if (root_timer) {
                root_timer->AddTimer(ptr, ptr->GetTotalInterval(), ptr->IsAlways());
            }
            else {
                AddTimer(ptr, ptr->GetTotalInterval(), ptr->IsAlways());
            }
        }
    }

    // add sub timer
    if (!_sub_timer) {
        return;
    }
    for (auto iter = sub_timer_solts.begin(); iter != sub_timer_solts.end(); iter++) {
        auto ptr = iter->lock();
        if (!ptr) {
            continue;
        }
        _sub_timer->InnerAddTimer(ptr, ptr->GetLeftInterval());
    }
}